

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_delta(OSQPWorkspace *work,c_float delta_new)

{
  long in_RDI;
  char *in_XMM0_Qa;
  c_int local_8;
  
  if (in_RDI == 0) {
    local_8 = _osqp_error(0,in_XMM0_Qa);
  }
  else if (0.0 < (double)in_XMM0_Qa) {
    *(char **)(*(long *)(in_RDI + 0xb8) + 0x70) = in_XMM0_Qa;
    local_8 = 0;
  }
  else {
    printf("ERROR in %s: ","osqp_update_delta");
    printf("delta must be positive");
    printf("\n");
    local_8 = 1;
  }
  return local_8;
}

Assistant:

c_int osqp_update_delta(OSQPWorkspace *work, c_float delta_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that delta is positive
  if (delta_new <= 0.) {
# ifdef PRINTING
    c_eprint("delta must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  // Update delta
  work->settings->delta = delta_new;

  return 0;
}